

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::disconnect(CoreBroker *this)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  bool bVar1;
  GlobalBrokerId id;
  CoreBroker *in_RDI;
  __sv_type _Var2;
  int cnt;
  ActionMessage *in_stack_fffffffffffffca8;
  Time message;
  Time in_stack_fffffffffffffcb0;
  BrokerBase *in_stack_fffffffffffffcb8;
  CoreBroker *in_stack_fffffffffffffcc0;
  milliseconds in_stack_fffffffffffffcc8;
  ActionMessage *in_stack_fffffffffffffcd0;
  ActionMessage *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined1 local_2f0 [30];
  BrokerState in_stack_fffffffffffffd2e;
  size_t local_238;
  char *local_230;
  undefined8 local_228;
  Time local_200;
  bool fromRemote;
  int logLevel;
  Time in_stack_fffffffffffffe10;
  Time in_stack_fffffffffffffe18;
  GlobalBrokerId in_stack_fffffffffffffe20;
  GlobalFederateId in_stack_fffffffffffffe24;
  GlobalFederateId in_stack_fffffffffffffe2c;
  GlobalFederateId local_1b4 [9];
  __sv_type local_190;
  __sv_type local_180;
  BaseType local_16c;
  GlobalFederateId local_168;
  int local_164;
  duration<long,std::ratio<1l,1000l>> local_160 [8];
  int local_158;
  format_args in_stack_ffffffffffffff10;
  string_view in_stack_ffffffffffffff20;
  string_view in_stack_ffffffffffffff50;
  size_t local_88 [2];
  undefined8 local_78;
  size_t *local_70;
  char *local_68;
  undefined8 uStack_60;
  size_t *local_50;
  char *local_48;
  undefined8 uStack_40;
  ActionMessage *local_38;
  size_t local_30;
  size_t *local_28;
  size_t *local_20;
  undefined8 *local_18;
  size_t local_10;
  size_t *local_8;
  
  ActionMessage::ActionMessage
            (in_stack_fffffffffffffcd0,(action_t)((ulong)in_stack_fffffffffffffcc8.__r >> 0x20));
  BrokerBase::addActionMessage
            ((BrokerBase *)in_stack_fffffffffffffcb0.internalTimeCode,in_stack_fffffffffffffca8);
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffcb0.internalTimeCode);
  local_158 = 0;
  do {
    local_164 = 200;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_160,&local_164);
    bVar1 = waitForDisconnect(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    local_158 = local_158 + 1;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &in_RDI->super_BrokerBase;
    local_16c = (BaseType)
                CLI::std::atomic<helics::GlobalBrokerId>::load
                          (&(in_RDI->super_BrokerBase).global_id,seq_cst);
    GlobalFederateId::GlobalFederateId(&local_168,(GlobalBrokerId)local_16c);
    getIdentifier_abi_cxx11_(in_RDI);
    local_180 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffcb0.internalTimeCode);
    BrokerBase::getBrokerState((BrokerBase *)0x520838);
    brokerStateName_abi_cxx11_(in_stack_fffffffffffffd2e);
    std::operator+((char *)in_RDI,__rhs);
    local_190 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffcb0.internalTimeCode);
    name._M_str._0_4_ = in_stack_fffffffffffffe20.gid;
    name._M_len = in_stack_fffffffffffffe18.internalTimeCode;
    name._M_str._4_4_ = in_stack_fffffffffffffe24.gid;
    in_stack_fffffffffffffcb0.internalTimeCode = (baseType)local_190._M_str;
    BrokerBase::sendToLogger
              ((BrokerBase *)in_stack_fffffffffffffe10.internalTimeCode,in_stack_fffffffffffffe2c,
               logLevel,name,in_stack_ffffffffffffff50,fromRemote);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcb0.internalTimeCode);
    if (local_158 % 4 == 0) {
      bVar1 = BrokerBase::isRunning((BrokerBase *)0x5208e2);
      if (!bVar1) {
        id = CLI::std::atomic<helics::GlobalBrokerId>::load
                       (&(in_RDI->super_BrokerBase).global_id,seq_cst);
        GlobalFederateId::GlobalFederateId(local_1b4,id);
        getIdentifier_abi_cxx11_(in_RDI);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcb0.internalTimeCode);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcc0,
                   (char *)in_stack_fffffffffffffcb8);
        name_00._M_str._0_4_ = in_stack_fffffffffffffe20.gid;
        name_00._M_len = in_stack_fffffffffffffe18.internalTimeCode;
        name_00._M_str._4_4_ = in_stack_fffffffffffffe24.gid;
        BrokerBase::sendToLogger
                  ((BrokerBase *)in_stack_fffffffffffffe10.internalTimeCode,
                   in_stack_fffffffffffffe2c,logLevel,name_00,in_stack_ffffffffffffff50,fromRemote);
        return;
      }
      in_stack_fffffffffffffe20 =
           CLI::std::atomic<helics::GlobalBrokerId>::load
                     (&(in_RDI->super_BrokerBase).global_id,seq_cst);
      GlobalFederateId::GlobalFederateId
                ((GlobalFederateId *)&stack0xfffffffffffffe24,in_stack_fffffffffffffe20);
      getIdentifier_abi_cxx11_(in_RDI);
      _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffcb0.internalTimeCode);
      in_stack_fffffffffffffe10.internalTimeCode = _Var2._M_len;
      in_stack_fffffffffffffe18.internalTimeCode = (baseType)_Var2._M_str;
      local_230 = "sending disconnect again; total message count = {}";
      local_228 = 0x32;
      local_238 = BrokerBase::currentMessageCounter(in_stack_fffffffffffffcb8);
      this_00 = (ActionMessage *)&stack0xfffffffffffffde0;
      local_48 = local_230;
      uStack_40 = local_228;
      local_50 = &local_238;
      local_68 = local_230;
      uStack_60 = local_228;
      local_28 = local_88;
      local_18 = &local_78;
      local_78 = 4;
      local_38 = this_00;
      local_30 = local_238;
      local_20 = local_28;
      local_10 = local_238;
      local_8 = local_28;
      local_88[0] = local_238;
      local_70 = local_28;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_ffffffffffffff20,in_stack_ffffffffffffff10);
      _local_200 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffcb0.internalTimeCode);
      in_stack_fffffffffffffcb0.internalTimeCode = local_200._8_8_;
      name_01._M_str._0_4_ = in_stack_fffffffffffffe20.gid;
      name_01._M_len = in_stack_fffffffffffffe18.internalTimeCode;
      name_01._M_str._4_4_ = in_stack_fffffffffffffe24.gid;
      message.internalTimeCode = local_200.internalTimeCode;
      BrokerBase::sendToLogger
                ((BrokerBase *)in_stack_fffffffffffffe10.internalTimeCode,in_stack_fffffffffffffe2c,
                 logLevel,name_01,in_stack_ffffffffffffff50,fromRemote);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcb0.internalTimeCode);
      in_stack_fffffffffffffcc0 = (CoreBroker *)&in_RDI->super_BrokerBase;
      in_stack_fffffffffffffcc8.__r = (rep)local_2f0;
      ActionMessage::ActionMessage(this_00,(action_t)((ulong)in_stack_fffffffffffffcc8.__r >> 0x20))
      ;
      BrokerBase::addActionMessage
                ((BrokerBase *)in_stack_fffffffffffffcb0.internalTimeCode,
                 (ActionMessage *)message.internalTimeCode);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffcb0.internalTimeCode);
    }
    if (local_158 % 0xd == 0) {
      std::operator<<((ostream *)&std::cerr,"waiting on disconnect\n");
    }
  } while( true );
}

Assistant:

void CoreBroker::disconnect()
{
    addActionMessage(CMD_USER_DISCONNECT);
    int cnt{0};
    while (!waitForDisconnect(std::chrono::milliseconds(200))) {
        ++cnt;
        LOG_WARNING(global_id.load(),
                    getIdentifier(),
                    "waiting on disconnect: current state=" + brokerStateName(getBrokerState()));
        if (cnt % 4 == 0) {
            if (!isRunning()) {
                LOG_WARNING(
                    global_id.load(),
                    getIdentifier(),
                    "main loop is stopped but have not received disconnect notice, assuming disconnected");
                return;
            }
            LOG_WARNING(global_id.load(),
                        getIdentifier(),
                        fmt::format("sending disconnect again; total message count = {}",
                                    currentMessageCounter()));
            addActionMessage(CMD_USER_DISCONNECT);
        }
        if (cnt % 13 == 0) {
            std::cerr << "waiting on disconnect\n";
        }
    }
}